

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

int helicsInputGetOption(HelicsInput inp,int option)

{
  int iVar1;
  
  iVar1 = 0;
  if ((inp != (HelicsInput)0x0) && (*inp == 0x3456e052)) {
    iVar1 = (**(code **)(**(long **)((long)inp + 0x18) + 0x18))();
  }
  return iVar1;
}

Assistant:

int helicsInputGetOption(HelicsInput inp, int option)
{
    auto* inpObj = verifyInput(inp, nullptr);
    if (inpObj == nullptr) {
        return HELICS_FALSE;
    }
    try {
        return (inpObj->inputPtr->getOption(option));
    }
    // LCOV_EXCL_START
    catch (...) {
        return HELICS_FALSE;
    }
    // LCOV_EXCL_STOP
}